

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.h
# Opt level: O2

int __thiscall Gradient::addPoint(Gradient *this,GradientPoint *point)

{
  const_iterator __position;
  
  for (__position._M_current =
            (this->points).super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>._M_impl
            .super__Vector_impl_data._M_start;
      (__position._M_current !=
       (this->points).super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>._M_impl.
       super__Vector_impl_data._M_finish &&
      ((__position._M_current)->units <= point->units &&
       point->units != (__position._M_current)->units));
      __position._M_current = __position._M_current + 1) {
  }
  std::vector<GradientPoint,_std::allocator<GradientPoint>_>::insert(&this->points,__position,point)
  ;
  return (int)(((long)(this->points).
                      super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->points).
                     super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x1c);
}

Assistant:

int addPoint(const GradientPoint &point) {
    auto i = points.begin();
    while (i != points.end() && i->units < point.units) i++;
    points.insert(i, point);
    return size();
  }